

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O2

ssize_t __thiscall
TCPConnection::recv(TCPConnection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  mutex *__m;
  ushort uVar1;
  State SVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  _Elt_pointer ppVar6;
  _Elt_pointer extraout_RAX;
  _Elt_pointer extraout_RAX_00;
  _Elt_pointer extraout_RAX_01;
  _Elt_pointer extraout_RAX_02;
  undefined4 in_register_00000034;
  long lVar7;
  int __flags_00;
  ulong uVar8;
  uchar *puVar9;
  uint uVar10;
  bool bVar12;
  unique_lock<std::mutex> lck1;
  unique_lock<std::mutex> lck0;
  const_iterator local_58;
  void *pvVar11;
  
  uVar8 = (ulong)(uint)__flags;
  lVar7 = CONCAT44(in_register_00000034,__fd);
  uVar1 = *(ushort *)(lVar7 + 0xc);
  uVar10 = uVar1 >> 2 & 0x3c;
  pvVar11 = (void *)(ulong)uVar10;
  if (__buf < pvVar11) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"malformed TCP segment. Size too small.");
    ppVar6 = (_Elt_pointer)std::endl<char,std::char_traits<char>>(poVar5);
    return (ssize_t)ppVar6;
  }
  ppVar6 = (_Elt_pointer)(__n & 0xffffffff);
  SVar2 = this->state_;
  if (SVar2 == SYN_SENT) {
    if ((uVar1 >> 10 & 1) == 0) {
      if ((uVar1 >> 9 & 1) == 0) {
        return (ssize_t)ppVar6;
      }
      uVar10 = *(uint *)(lVar7 + 4);
      uVar10 = (uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18)
               + 1;
      this->ack_number_ =
           uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 * 0x1000000;
      ppVar6 = (_Elt_pointer)send(this,0,(void *)0x0,0x1050,__flags);
      this->state_ = ESTABLISHED;
      this->poll_flags_ = this->poll_flags_ | 0x304;
      if ((this->established_cb_).super__Function_base._M_manager == (_Manager_type)0x0) {
        return (ssize_t)ppVar6;
      }
      std::function<void_(int)>::operator()(&this->established_cb_,0);
      return (ssize_t)extraout_RAX;
    }
    if ((uVar1 >> 0xc & 1) == 0) {
      return (ssize_t)ppVar6;
    }
  }
  else {
    if (SVar2 == CLOSED) {
      ppVar6 = (_Elt_pointer)
               send(this,0,(void *)0x0,(ulong)(uVar1 & 0x1000 ^ 0x1450),
                    (uint)(ushort)(*(ushort *)(lVar7 + 2) << 8 | *(ushort *)(lVar7 + 2) >> 8));
      return (ssize_t)ppVar6;
    }
    if (((uVar1 >> 10 & 1) == 0) ||
       ((ppVar6 = (_Elt_pointer)(ulong)(SVar2 - ESTABLISHED), 3 < SVar2 - ESTABLISHED &&
        (ppVar6 = (_Elt_pointer)(ulong)(SVar2 - CLOSING), 2 < SVar2 - CLOSING)))) {
      bVar12 = (uVar1 >> 9 & 1) == 0;
      if (7 < SVar2 - SYN_RECEIVED || bVar12) {
        if ((uVar1 >> 0xc & 1) == 0) {
          return (ssize_t)(_Elt_pointer)CONCAT71((int7)((ulong)ppVar6 >> 8),bVar12);
        }
        uVar3 = *(uint *)(lVar7 + 8);
        __m = &this->_read_m;
        do {
          __flags_00 = (int)uVar8;
          ppVar6 = (this->send_buf_).
                   super__Deque_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (ppVar6 == (this->send_buf_).
                        super__Deque_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
LAB_00104742:
            if (__buf != pvVar11) {
              std::unique_lock<std::mutex>::unique_lock(&lck1,__m);
              local_58._M_cur =
                   (this->_recv_buf).
                   super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur;
              local_58._M_first =
                   (this->_recv_buf).
                   super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_first;
              local_58._M_last =
                   (this->_recv_buf).
                   super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_last;
              local_58._M_node =
                   (this->_recv_buf).
                   super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node;
              puVar9 = (uchar *)((long)__buf + lVar7);
              std::deque<unsigned_char,std::allocator<unsigned_char>>::
              insert<unsigned_char_const*,void>
                        ((iterator *)&lck0,
                         (deque<unsigned_char,std::allocator<unsigned_char>> *)&this->_recv_buf,
                         &local_58,(uchar *)((long)pvVar11 + lVar7),puVar9);
              __flags_00 = (int)puVar9;
              *(byte *)&this->poll_flags_ = (byte)this->poll_flags_ | 0xc3;
              std::unique_lock<std::mutex>::unlock(&lck1);
              uVar3 = this->ack_number_;
              uVar10 = (uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                       uVar3 << 0x18) + ((int)__buf - uVar10);
              this->ack_number_ =
                   uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                   uVar10 * 0x1000000;
              send(this,0,(void *)0x0,0x1050,__flags_00);
              std::unique_lock<std::mutex>::~unique_lock(&lck1);
              ppVar6 = extraout_RAX_01;
            }
            if ((uVar1 >> 8 & 1) == 0) {
              return (ssize_t)ppVar6;
            }
            uVar10 = this->ack_number_;
            uVar10 = (uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                     uVar10 << 0x18) + 1;
            this->ack_number_ =
                 uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                 uVar10 * 0x1000000;
            send(this,0,(void *)0x0,0x1050,__flags_00);
            if (this->state_ - FIN_WAIT_1 < 2) {
              this->state_ = TIME_WAIT;
              lck1._M_device = (mutex_type *)0x0;
              lck0._M_device = (mutex_type *)operator_new(0x10);
              ((lck0._M_device)->super___mutex_base)._M_mutex.__align = (long)&PTR___State_0010fc28;
              *(TCPConnection **)((long)&((lck0._M_device)->super___mutex_base)._M_mutex + 8) = this
              ;
              std::thread::_M_start_thread(&lck1,&lck0,0);
              if (lck0._M_device != (mutex_type *)0x0) {
                (**(code **)(((lck0._M_device)->super___mutex_base)._M_mutex.__align + 8))();
              }
              std::thread::detach();
              std::thread::~thread((thread *)&lck1);
              ppVar6 = extraout_RAX_02;
            }
            else {
              uVar10 = this->state_ - SYN_RECEIVED;
              ppVar6 = (_Elt_pointer)(ulong)uVar10;
              if (uVar10 < 2) {
                this->state_ = CLOSE_WAIT;
              }
            }
            *(byte *)&this->poll_flags_ = (byte)this->poll_flags_ | 0xc3;
            return (ssize_t)ppVar6;
          }
          std::unique_lock<std::mutex>::unique_lock(&lck0,__m);
          ppVar6 = (this->send_buf_).
                   super__Deque_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          std::unique_lock<std::mutex>::unlock(&lck0);
          __flags_00 = (int)uVar8;
          puVar9 = ppVar6->first;
          uVar4 = *(uint *)(puVar9 + 4);
          if ((uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18) <
              (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18) +
              (int)ppVar6->second) {
            std::unique_lock<std::mutex>::~unique_lock(&lck0);
            ppVar6 = extraout_RAX_00;
            goto LAB_00104742;
          }
          if ((puVar9[0xd] & 1) == 0) {
LAB_001046f7:
            operator_delete__(puVar9);
          }
          else {
            if (this->state_ != LAST_ACK) {
              if (this->state_ == FIN_WAIT_1) {
                this->state_ = FIN_WAIT_2;
              }
              goto LAB_001046f7;
            }
            this->state_ = CLOSED;
            if ((this->close_cb_).super__Function_base._M_manager == (_Manager_type)0x0)
            goto LAB_001046f7;
            std::function<void_(int)>::operator()(&this->close_cb_,0);
            puVar9 = ppVar6->first;
            if (puVar9 != (uchar *)0x0) goto LAB_001046f7;
          }
          std::unique_lock<std::mutex>::unique_lock(&lck1,__m);
          std::
          deque<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
          ::pop_front(&this->send_buf_);
          std::unique_lock<std::mutex>::unlock(&lck1);
          std::unique_lock<std::mutex>::~unique_lock(&lck1);
          std::unique_lock<std::mutex>::~unique_lock(&lck0);
        } while( true );
      }
      uVar10 = this->ack_number_;
      uVar10 = (uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18)
               + 1;
      this->ack_number_ =
           uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 * 0x1000000;
      ppVar6 = (_Elt_pointer)send(this,0,(void *)0x0,0x1450,__flags);
    }
  }
  this->state_ = CLOSED;
  return (ssize_t)ppVar6;
}

Assistant:

void TCPConnection::recv(uint8_t const *data, size_t len, uint32_t from_ip) noexcept {
    auto *tcp = reinterpret_cast<tcp_t const *>(data);
    uint16_t flags = tcp->flags;
    uint16_t header_len = ((flags & 0x00f0) >> 4) * 4;
    if (header_len > len) {
        std::cerr << "malformed TCP segment. Size too small." << std::endl;
        return;
    }

    size_t payload_size = len - header_len;

    // step 1 If the state is CLOSED
    if (state_ == State::CLOSED) {
        send(nullptr, 0,
             has_ack(flags) ? get_flags({RST_MASK}) : get_flags({RST_MASK, ACK_MASK}),
             ntohs(tcp->dst_port),
             ntohs(tcp->src_port),
             has_ack(flags) ? tcp->ack : 0,
             has_ack(flags) ? 0 : nl_add_hl(tcp->seq, payload_size),
             src_ip_,
             from_ip
        );
        return;
    }

    // step 2   If the state is LISTEN then

    // step 3   If the state is SYN-SENT then
    if (state_ == State::SYN_SENT) {
        if (has_ack(flags)) {
            //  If SEG.ACK =< ISS, or SEG.ACK > SND.NXT, send a reset (unless
            //  the RST bit is set, if so drop the segment and return)
        }

        if (has_rst(flags)) {
            if (has_ack(flags)) {
                // signal the user "error: connection reset"
                state_ = State::CLOSED;
            }
            return;
        }

        if (has_syn(flags)) {
            ack_number_ = tcp->seq;
            inc_ack_number(1);
            send(nullptr, 0, get_flags({ACK_MASK}));
            state_ = State::ESTABLISHED;
            poll_flags_ |= (POLLOUT | POLLWRNORM | POLLWRBAND);
            if (established_cb_) {
                established_cb_(0);
            }
        }
        return;
    }

    // otherwise
    // first check sequence number
    if (has_rst(flags)) {
        switch (state_) {
            case State::ESTABLISHED:
            case State::FIN_WAIT_1:
            case State::FIN_WAIT_2:
            case State::CLOSE_WAIT:
//                If the RST bit is set then, any outstanding RECEIVEs and SEND
//                should receive "reset" responses.  All segment queues should be
//                flushed.  Users should also receive an unsolicited general
//                "connection reset" signal.  Enter the CLOSED state, delete the
//                TCB, and return.
                state_ = State::CLOSED;
                return;
            case State::CLOSING:
            case State::LAST_ACK:
            case State::TIME_WAIT:
                state_ = State::CLOSED;
                return;
        }
    }

    if (has_syn(flags)) {
        switch (state_) {
            case State::SYN_RECEIVED:
            case State::ESTABLISHED:
            case State::FIN_WAIT_1:
            case State::FIN_WAIT_2:
            case State::CLOSE_WAIT:
            case State::CLOSING:
            case State::LAST_ACK:
            case State::TIME_WAIT:
                inc_ack_number(1);
                send(nullptr, 0, get_flags({RST_MASK, ACK_MASK}));
                state_ = State::CLOSED;
                return;
        }
    }

    if (!has_ack(flags)) {
        return;
    }

    uint32_t acked = ntohl(tcp->ack);
    while (!send_buf_.empty()) {
        std::unique_lock lck0(_read_m);
        auto &p = send_buf_.front();
        lck0.unlock();
        auto *packet = reinterpret_cast<tcp_t *>(p.first);
        uint32_t next_seq = ntohl(nl_add_hl(packet->seq, p.second));
        if (next_seq <= acked) {
            if (has_fin(packet->flags)) {
                if (state_ == State::FIN_WAIT_1) {
                    state_ = State::FIN_WAIT_2;
                } else if (state_ == State::LAST_ACK) {
                    state_ = State::CLOSED;
                    if (close_cb_) {
                        close_cb_(0);
                    }
                }
            }
            delete[] p.first;
            std::unique_lock lck1(_read_m);
            send_buf_.pop_front();
            lck1.unlock();
        } else {
            break;
        }
    }

    if (payload_size > 0) {
        std::unique_lock<std::mutex> lck(_read_m);
        uint8_t const *payload = data + header_len;
        _recv_buf.insert(_recv_buf.end(), payload, payload + payload_size);
        poll_flags_ |= (POLLIN | POLLPRI | POLLRDNORM | POLLRDBAND);
        lck.unlock();
        inc_ack_number(payload_size);
        send(nullptr, 0, get_flags({ACK_MASK}));
    }

    if (has_fin(flags)) {
        inc_ack_number(1);
        send(nullptr, 0, get_flags({ACK_MASK}));

        switch (state_) {
            case State::SYN_RECEIVED:
            case State::ESTABLISHED:
                state_ = State::CLOSE_WAIT;
                break;
            case State::FIN_WAIT_1:
            case State::FIN_WAIT_2:
                state_ = State::TIME_WAIT;
                std::thread([&] {
                    std::this_thread::sleep_for(std::chrono::milliseconds(1000 * 2));
                    state_ = State::CLOSED;
                }).detach();
                break;
            case State::CLOSE_WAIT:
            case State::CLOSING:
            case State::LAST_ACK:
                break;
            case State::TIME_WAIT:
                break;
        }
        poll_flags_ |= (POLLIN | POLLPRI | POLLRDNORM | POLLRDBAND);
    }
}